

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O0

_Bool Curl_conn_is_tcp_listen(Curl_easy *data,int sockindex)

{
  Curl_cfilter *local_28;
  Curl_cfilter *cf;
  int sockindex_local;
  Curl_easy *data_local;
  
  local_28 = data->conn->cfilter[sockindex];
  while( true ) {
    if (local_28 == (Curl_cfilter *)0x0) {
      return false;
    }
    if (local_28->cft == &Curl_cft_tcp_accept) break;
    local_28 = local_28->next;
  }
  return true;
}

Assistant:

bool Curl_conn_is_tcp_listen(struct Curl_easy *data,
                             int sockindex)
{
  struct Curl_cfilter *cf = data->conn->cfilter[sockindex];
  while(cf) {
    if(cf->cft == &Curl_cft_tcp_accept)
      return TRUE;
    cf = cf->next;
  }
  return FALSE;
}